

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JitTransferData.cpp
# Opt level: O1

void __thiscall JitTransferData::Cleanup(JitTransferData *this)

{
  PinnedTypeRefsIDL *obj;
  NativeCodeData *this_00;
  Type lpMem;
  HANDLE pVVar1;
  Type lpMem_00;
  Type current;
  ulong uVar2;
  
  (this->jitTimeTypeRefs).ptr =
       (BaseHashSet<void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_void_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  if (this->lazyBailoutProperties != (int *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,int>
              (&Memory::HeapAllocator::Instance,(long)this->lazyBailoutPropertyCount,
               this->lazyBailoutProperties);
    this->lazyBailoutProperties = (Type)0x0;
  }
  obj = (this->runtimeTypeRefs).ptr;
  if (obj != (PinnedTypeRefsIDL *)0x0) {
    if (obj->isOOPJIT == '\0') {
      Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,PinnedTypeRefsIDL>
                (&Memory::HeapAllocator::Instance,obj,(ulong)obj->count << 3);
    }
    else {
      pVVar1 = GetProcessHeap();
      HeapFree(pVVar1,0,(this->runtimeTypeRefs).ptr);
    }
    (this->runtimeTypeRefs).ptr = (PinnedTypeRefsIDL *)0x0;
  }
  if (this->propertyGuardsByPropertyId != (TypeGuardTransferEntry *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::TypeGuardTransferEntry>
              (&Memory::HeapAllocator::Instance,this->propertyGuardsByPropertyId,
               this->propertyGuardsByPropertyIdPlusSize);
    this->propertyGuardsByPropertyId = (Type)0x0;
  }
  this->propertyGuardCount = 0;
  this->propertyGuardsByPropertyIdPlusSize = 0;
  if (this->ctorCacheGuardsByPropertyId != (CtorCacheGuardTransferEntry *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::CtorCacheGuardTransferEntry>
              (&Memory::HeapAllocator::Instance,this->ctorCacheGuardsByPropertyId,
               this->ctorCacheGuardsByPropertyIdPlusSize);
    this->ctorCacheGuardsByPropertyId = (Type)0x0;
  }
  this->ctorCacheGuardsByPropertyIdPlusSize = 0;
  if (this->equivalentTypeGuards != (JitEquivalentTypeGuard **)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,Js::JitEquivalentTypeGuard*>
              (&Memory::HeapAllocator::Instance,(long)this->equivalentTypeGuardCount,
               this->equivalentTypeGuards);
    this->equivalentTypeGuards = (Type)0x0;
  }
  this->equivalentTypeGuardCount = 0;
  this_00 = this->jitTransferRawData;
  if (this_00 != (NativeCodeData *)0x0) {
    NativeCodeData::~NativeCodeData(this_00);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,8);
    this->jitTransferRawData = (Type)0x0;
  }
  if (this->equivalentTypeGuardOffsets == (Type)0x0) goto LAB_00575108;
  pVVar1 = GetProcessHeap();
  lpMem_00 = (Type)this->equivalentTypeGuardOffsets;
  while( true ) {
    HeapFree(pVVar1,0,lpMem_00);
LAB_00575108:
    lpMem_00 = (this->typeGuardTransferData).entries;
    if (lpMem_00 == (Type)0x0) break;
    (this->typeGuardTransferData).entries = lpMem_00->next;
    pVVar1 = GetProcessHeap();
  }
  lpMem = (this->ctorCacheTransferData).entries;
  if (lpMem != (Type)0x0) {
    if ((this->ctorCacheTransferData).ctorCachesCount != 0) {
      uVar2 = 0;
      do {
        if (lpMem[uVar2] != (CtorCacheTransferEntryIDL *)0x0) {
          pVVar1 = GetProcessHeap();
          HeapFree(pVVar1,0,lpMem[uVar2]);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (this->ctorCacheTransferData).ctorCachesCount);
    }
    pVVar1 = GetProcessHeap();
    HeapFree(pVVar1,0,lpMem);
    return;
  }
  return;
}

Assistant:

void JitTransferData::Cleanup()
{
    // This dictionary is recycler allocated so it doesn't need to be explicitly freed.
    this->jitTimeTypeRefs = nullptr;

    if (this->lazyBailoutProperties != nullptr)
    {
        HeapDeleteArray(this->lazyBailoutPropertyCount, this->lazyBailoutProperties);
        this->lazyBailoutProperties = nullptr;
    }

    // All structures below are heap allocated and need to be freed explicitly.
    if (this->runtimeTypeRefs != nullptr)
    {
        if (this->runtimeTypeRefs->isOOPJIT)
        {
            midl_user_free(this->runtimeTypeRefs);
        }
        else
        {
            HeapDeletePlus(offsetof(PinnedTypeRefsIDL, typeRefs) + sizeof(void*)*this->runtimeTypeRefs->count - sizeof(PinnedTypeRefsIDL),
                PointerValue(this->runtimeTypeRefs));
        }
        this->runtimeTypeRefs = nullptr;
    }

    if (this->propertyGuardsByPropertyId != nullptr)
    {
        HeapDeletePlus(this->propertyGuardsByPropertyIdPlusSize, this->propertyGuardsByPropertyId);
        this->propertyGuardsByPropertyId = nullptr;
    }
    this->propertyGuardCount = 0;
    this->propertyGuardsByPropertyIdPlusSize = 0;

    if (this->ctorCacheGuardsByPropertyId != nullptr)
    {
        HeapDeletePlus(this->ctorCacheGuardsByPropertyIdPlusSize, this->ctorCacheGuardsByPropertyId);
        this->ctorCacheGuardsByPropertyId = nullptr;
    }
    this->ctorCacheGuardsByPropertyIdPlusSize = 0;

    if (this->equivalentTypeGuards != nullptr)
    {
        HeapDeleteArray(this->equivalentTypeGuardCount, this->equivalentTypeGuards);
        this->equivalentTypeGuards = nullptr;
    }
    this->equivalentTypeGuardCount = 0;

    if (this->jitTransferRawData != nullptr)
    {
        HeapDelete(this->jitTransferRawData);
        this->jitTransferRawData = nullptr;
    }

    if (this->equivalentTypeGuardOffsets)
    {
        midl_user_free(this->equivalentTypeGuardOffsets);
    }

    if (this->typeGuardTransferData.entries != nullptr)
    {
        auto next = &this->typeGuardTransferData.entries;
        while (*next)
        {
            auto current = (*next);
            *next = (*next)->next;
            midl_user_free(current);
        }
    }

    if (this->ctorCacheTransferData.entries != nullptr)
    {
        CtorCacheTransferEntryIDL ** entries = this->ctorCacheTransferData.entries;
        for (uint i = 0; i < this->ctorCacheTransferData.ctorCachesCount; ++i)
        {
            midl_user_free(entries[i]);
        }
        midl_user_free(entries);
    }
}